

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaConstructionCtxtPtr xmlSchemaConstructionCtxtCreate(xmlDictPtr dict)

{
  xmlSchemaItemListPtr pxVar1;
  xmlSchemaConstructionCtxtPtr ret;
  xmlDictPtr dict_local;
  
  dict_local = (xmlDictPtr)(*xmlMalloc)(0x48);
  if ((xmlSchemaConstructionCtxtPtr)dict_local == (xmlSchemaConstructionCtxtPtr)0x0) {
    xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0,"allocating schema construction context",
                        (xmlNodePtr)0x0);
    dict_local = (xmlDictPtr)0x0;
  }
  else {
    memset(dict_local,0,0x48);
    pxVar1 = xmlSchemaItemListCreate();
    ((xmlSchemaConstructionCtxtPtr)dict_local)->buckets = pxVar1;
    if (((xmlSchemaConstructionCtxtPtr)dict_local)->buckets == (xmlSchemaItemListPtr)0x0) {
      xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0,"allocating list of schema buckets",
                          (xmlNodePtr)0x0);
      (*xmlFree)(dict_local);
      dict_local = (xmlDictPtr)0x0;
    }
    else {
      pxVar1 = xmlSchemaItemListCreate();
      ((xmlSchemaConstructionCtxtPtr)dict_local)->pending = pxVar1;
      if (((xmlSchemaConstructionCtxtPtr)dict_local)->pending == (xmlSchemaItemListPtr)0x0) {
        xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0,
                            "allocating list of pending global components",(xmlNodePtr)0x0);
        xmlSchemaConstructionCtxtFree((xmlSchemaConstructionCtxtPtr)dict_local);
        dict_local = (xmlDictPtr)0x0;
      }
      else {
        ((xmlSchemaConstructionCtxtPtr)dict_local)->dict = dict;
        xmlDictReference(dict);
      }
    }
  }
  return (xmlSchemaConstructionCtxtPtr)dict_local;
}

Assistant:

static xmlSchemaConstructionCtxtPtr
xmlSchemaConstructionCtxtCreate(xmlDictPtr dict)
{
    xmlSchemaConstructionCtxtPtr ret;

    ret = (xmlSchemaConstructionCtxtPtr)
	xmlMalloc(sizeof(xmlSchemaConstructionCtxt));
    if (ret == NULL) {
        xmlSchemaPErrMemory(NULL,
	    "allocating schema construction context", NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaConstructionCtxt));

    ret->buckets = xmlSchemaItemListCreate();
    if (ret->buckets == NULL) {
	xmlSchemaPErrMemory(NULL,
	    "allocating list of schema buckets", NULL);
	xmlFree(ret);
        return (NULL);
    }
    ret->pending = xmlSchemaItemListCreate();
    if (ret->pending == NULL) {
	xmlSchemaPErrMemory(NULL,
	    "allocating list of pending global components", NULL);
	xmlSchemaConstructionCtxtFree(ret);
        return (NULL);
    }
    ret->dict = dict;
    xmlDictReference(dict);
    return(ret);
}